

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamToolsIndex::Jump
          (BamToolsIndex *this,BamRegion *region,bool *hasAlignmentsInRegion)

{
  int iVar1;
  BamReaderPrivate *this_00;
  bool bVar2;
  RefVector *this_01;
  const_reference pvVar3;
  int64_t offset;
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  *hasAlignmentsInRegion = false;
  this_00 = (this->super_BamIndex).m_reader;
  if ((this_00 == (BamReaderPrivate *)0x0) || (bVar2 = BamReaderPrivate::IsOpen(this_00), !bVar2)) {
    std::__cxx11::string::string((string *)&local_60,"BamToolsIndex::Jump",&local_61);
    std::__cxx11::string::string((string *)&local_40,"could not jump: reader is not open",&local_62)
    ;
    BamIndex::SetErrorString(&this->super_BamIndex,&local_60,&local_40);
  }
  else {
    this_01 = BamReaderPrivate::GetReferenceData((this->super_BamIndex).m_reader);
    iVar1 = region->LeftPosition;
    pvVar3 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                       (this_01,(long)region->LeftRefID);
    if (iVar1 <= pvVar3->RefLength) {
      GetOffset(this,region,(int64_t *)&local_60,hasAlignmentsInRegion);
      bVar2 = BamReaderPrivate::Seek((this->super_BamIndex).m_reader,(int64_t *)&local_60);
      return bVar2;
    }
    std::__cxx11::string::string((string *)&local_60,"BamToolsIndex::Jump",&local_61);
    std::__cxx11::string::string
              ((string *)&local_40,"could not create index: invalid region requested",&local_62);
    BamIndex::SetErrorString(&this->super_BamIndex,&local_60,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return false;
}

Assistant:

bool BamToolsIndex::Jump(const BamTools::BamRegion& region, bool* hasAlignmentsInRegion) {

    // clear flag
    *hasAlignmentsInRegion = false;

    // skip if invalid reader or not open
    if ( m_reader == 0 || !m_reader->IsOpen() ) {
        SetErrorString("BamToolsIndex::Jump", "could not jump: reader is not open");
        return false;
    }

    // make sure left-bound position is valid
    const RefVector& references = m_reader->GetReferenceData();
    if ( region.LeftPosition > references.at(region.LeftRefID).RefLength ) {
        SetErrorString("BamToolsIndex::Jump", "could not create index: invalid region requested");
        return false;
    }

    // calculate nearest offset to jump to
    int64_t offset;
    try {
        GetOffset(region, offset, hasAlignmentsInRegion);
    } catch ( BamException& e ) {
        m_errorString = e.what();
        return false;
    }

    // return success/failure of seek
    return m_reader->Seek(offset);
}